

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O2

ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> *
getFileAux<llvm::MemoryBuffer>
          (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
           *__return_storage_ptr__,Twine *Filename,int64_t FileSize,uint64_t MapSize,uint64_t Offset
          ,bool RequiresNullTerminator,bool IsVolatile)

{
  undefined8 in_RAX;
  error_code eVar1;
  error_code EC;
  int FD;
  
  FD = (int)((ulong)in_RAX >> 0x20);
  eVar1 = llvm::sys::fs::openFileForRead(Filename,&FD,F_None,(SmallVectorImpl<char> *)0x0);
  EC._M_cat = eVar1._M_cat;
  if (eVar1._M_value == 0) {
    getOpenFileImpl<llvm::MemoryBuffer>
              (__return_storage_ptr__,FD,Filename,FileSize,MapSize,Offset,RequiresNullTerminator,
               IsVolatile);
    close(FD);
  }
  else {
    EC._4_4_ = 0;
    EC._M_value = eVar1._M_value;
    llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
    ErrorOr(__return_storage_ptr__,EC);
  }
  return __return_storage_ptr__;
}

Assistant:

static ErrorOr<std::unique_ptr<MB>>
getFileAux(const Twine &Filename, int64_t FileSize, uint64_t MapSize,
           uint64_t Offset, bool RequiresNullTerminator, bool IsVolatile) {
  int FD;
  std::error_code EC = sys::fs::openFileForRead(Filename, FD, sys::fs::OF_None);

  if (EC)
    return EC;

  auto Ret = getOpenFileImpl<MB>(FD, Filename, FileSize, MapSize, Offset,
                                 RequiresNullTerminator, IsVolatile);
  close(FD);
  return Ret;
}